

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BankAccount.cpp
# Opt level: O0

void __thiscall L13_2::BankAccount::withdraw(BankAccount *this,double amount)

{
  ostream *poVar1;
  double amount_local;
  BankAccount *this_local;
  
  if (0.0 <= amount) {
    if (amount < this->_balance || amount == this->_balance) {
      this->_balance = this->_balance - amount;
    }
    else {
      std::operator<<((ostream *)&std::cout,"Withdraw failed. not enough remaining balance.\n");
    }
  }
  else {
    poVar1 = std::operator<<((ostream *)&std::cout,"Withdraw failed. negative value(");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,amount);
    std::operator<<(poVar1,") not allowed.\n");
  }
  return;
}

Assistant:

void BankAccount::withdraw(double amount) {
        if (amount < 0) {
            cout << "Withdraw failed. negative value(" << amount << ") not allowed.\n";
            return;
        }
        if (amount > _balance) {
            cout << "Withdraw failed. not enough remaining balance.\n";
            return;
        }
        _balance -= amount;
    }